

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool cs_system_impl::mkdir_dirs
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *dirs,uint mode,bool absolute_path)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  pointer pbVar5;
  __string_type __str;
  string path;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (mode != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_50,0,0,'\x01');
  }
  pbVar5 = (dirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (dirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = true;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + pbVar5->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
      std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      iVar3 = get_file_type(&local_50);
      if ((iVar3 != 4) && (iVar3 = mkdir(local_50._M_dataplus._M_p,0x1ed), iVar3 != 0)) {
        bVar4 = false;
        break;
      }
      pbVar5 = pbVar5 + 1;
      bVar4 = true;
    } while (pbVar5 != pbVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

static bool mkdir_dirs(const std::vector<std::string> &dirs, unsigned int mode, bool absolute_path = false)
	{
		std::string path;
		if (absolute_path)
			path = cs::path_separator;
		for (const auto &dir: dirs) {
			path += dir + cs::path_separator;
			if (is_directory(path))
				continue;
			if (!mkdir_impl(path, mode))
				return false;
		}
		return true;
	}